

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void strftimeFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  uchar *puVar2;
  sqlite3 *psVar3;
  int in_ESI;
  sqlite3_context *in_RDI;
  int wd;
  DateTime y;
  int nDay;
  double s;
  char zBuf [100];
  char *zFmt;
  sqlite3 *db;
  char *z;
  size_t j;
  size_t i;
  u64 n;
  DateTime x;
  _func_void_void_ptr *in_stack_fffffffffffffeb8;
  ulong in_stack_fffffffffffffec0;
  sqlite3 *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  sqlite3_value **in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  double local_f0;
  undefined1 local_e8 [104];
  undefined1 *local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  double local_28;
  sqlite3_context *local_8;
  
  if (in_ESI == 0) {
    return;
  }
  local_8 = in_RDI;
  puVar2 = sqlite3_value_text((sqlite3_value *)0x1e074d);
  if (puVar2 == (uchar *)0x0) {
    return;
  }
  iVar1 = isDate((sqlite3_context *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                 in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
                 (DateTime *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  if (iVar1 != 0) {
    return;
  }
  psVar3 = sqlite3_context_db_handle(local_8);
  local_50 = 1;
  for (local_58 = 0; puVar2[local_58] != '\0'; local_58 = local_58 + 1) {
    if (puVar2[local_58] == '%') {
      in_stack_fffffffffffffec8 = (sqlite3 *)(ulong)(puVar2[local_58 + 1] - 0x25);
      switch(in_stack_fffffffffffffec8) {
      default:
        return;
      case (sqlite3 *)0x23:
      case (sqlite3 *)0x28:
      case (sqlite3 *)0x2e:
      case (sqlite3 *)0x32:
      case (sqlite3 *)0x3f:
      case (sqlite3 *)0x48:
        local_50 = local_50 + 1;
      case (sqlite3 *)0x0:
      case (sqlite3 *)0x52:
        break;
      case (sqlite3 *)0x25:
      case (sqlite3 *)0x4e:
        local_50 = local_50 + 0x32;
        break;
      case (sqlite3 *)0x34:
        local_50 = local_50 + 8;
        break;
      case (sqlite3 *)0x41:
        local_50 = local_50 + 8;
        break;
      case (sqlite3 *)0x45:
        local_50 = local_50 + 3;
      }
      local_58 = local_58 + 1;
    }
    local_50 = local_50 + 1;
  }
  if (local_50 < 100) {
    local_68 = local_e8;
  }
  else {
    if ((ulong)(long)psVar3->aLimit[0] < local_50) {
      sqlite3_result_error_toobig((sqlite3_context *)0x1e092c);
      return;
    }
    local_68 = (undefined1 *)
               sqlite3DbMallocRawNN(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    if (local_68 == (undefined1 *)0x0) {
      sqlite3_result_error_nomem((sqlite3_context *)0x1e0969);
      return;
    }
  }
  computeJD((DateTime *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  computeYMD_HMS((DateTime *)0x1e098c);
  local_60 = 0;
  for (local_58 = 0; puVar2[local_58] != '\0'; local_58 = local_58 + 1) {
    if (puVar2[local_58] == '%') {
      local_58 = local_58 + 1;
      in_stack_fffffffffffffec0 = (ulong)(puVar2[local_58] - 0x48);
      switch(in_stack_fffffffffffffec0) {
      case 0:
        sqlite3_snprintf(3,local_68 + local_60,"%02d",(ulong)local_34);
        local_60 = local_60 + 2;
        break;
      default:
        local_68[local_60] = 0x25;
        local_60 = local_60 + 1;
        break;
      case 2:
        sqlite3_snprintf((int)((double)local_48 / 86400000.0),(char *)0x14,local_68 + local_60,
                         "%.16g");
        iVar1 = sqlite3Strlen30((char *)in_stack_fffffffffffffeb8);
        local_60 = iVar1 + local_60;
        break;
      case 5:
        sqlite3_snprintf(3,local_68 + local_60,"%02d",(ulong)local_30);
        local_60 = local_60 + 2;
        break;
      case 0xb:
        sqlite3_snprintf(3,local_68 + local_60,"%02d",(ulong)(uint)(int)local_28);
        local_60 = local_60 + 2;
        break;
      case 0xf:
      case 0x22:
        memcpy(&stack0xfffffffffffffed8,&local_48,0x30);
        computeJD((DateTime *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
        iVar1 = (int)(((local_48 - (long)in_stack_fffffffffffffed8) + 43200000) / 86400000);
        if (puVar2[local_58] == 'W') {
          in_stack_fffffffffffffed4 = (int)(((local_48 + 43200000) / 86400000) % 7);
          sqlite3_snprintf(3,local_68 + local_60,"%02d",
                           (long)((iVar1 + 7) - in_stack_fffffffffffffed4) / 7 & 0xffffffff);
          local_60 = local_60 + 2;
        }
        else {
          sqlite3_snprintf(4,local_68 + local_60,"%03d",(ulong)(iVar1 + 1));
          local_60 = local_60 + 3;
        }
        break;
      case 0x11:
        sqlite3_snprintf(5,local_68 + local_60,"%04d",(ulong)local_40);
        iVar1 = sqlite3Strlen30((char *)in_stack_fffffffffffffeb8);
        local_60 = iVar1 + local_60;
        break;
      case 0x1c:
        sqlite3_snprintf(3,local_68 + local_60,"%02d",(ulong)local_38);
        local_60 = local_60 + 2;
        break;
      case 0x1e:
        local_f0 = local_28;
        if (59.999 < local_28) {
          local_f0 = 59.999;
        }
        sqlite3_snprintf((int)local_f0,(char *)0x7,local_68 + local_60,"%06.3f");
        iVar1 = sqlite3Strlen30((char *)in_stack_fffffffffffffeb8);
        local_60 = iVar1 + local_60;
        break;
      case 0x25:
        sqlite3_snprintf(3,local_68 + local_60,"%02d",(ulong)local_3c);
        local_60 = local_60 + 2;
        break;
      case 0x2b:
        sqlite3_snprintf(0x1e,local_68 + local_60,"%lld",local_48 / 1000 + -0x3118a36940);
        iVar1 = sqlite3Strlen30((char *)in_stack_fffffffffffffeb8);
        local_60 = iVar1 + local_60;
        break;
      case 0x2f:
        local_68[local_60] = (char)(((local_48 + 0x7b98a00) / 86400000) % 7) + '0';
        local_60 = local_60 + 1;
      }
    }
    else {
      local_68[local_60] = puVar2[local_58];
      local_60 = local_60 + 1;
    }
  }
  local_68[local_60] = 0;
  sqlite3_result_text((sqlite3_context *)
                      CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                      (char *)in_stack_fffffffffffffec8,(int)(in_stack_fffffffffffffec0 >> 0x20),
                      in_stack_fffffffffffffeb8);
  return;
}

Assistant:

static void strftimeFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  DateTime x;
  u64 n;
  size_t i,j;
  char *z;
  sqlite3 *db;
  const char *zFmt;
  char zBuf[100];
  if( argc==0 ) return;
  zFmt = (const char*)sqlite3_value_text(argv[0]);
  if( zFmt==0 || isDate(context, argc-1, argv+1, &x) ) return;
  db = sqlite3_context_db_handle(context);
  for(i=0, n=1; zFmt[i]; i++, n++){
    if( zFmt[i]=='%' ){
      switch( zFmt[i+1] ){
        case 'd':
        case 'H':
        case 'm':
        case 'M':
        case 'S':
        case 'W':
          n++;
          /* fall thru */
        case 'w':
        case '%':
          break;
        case 'f':
          n += 8;
          break;
        case 'j':
          n += 3;
          break;
        case 'Y':
          n += 8;
          break;
        case 's':
        case 'J':
          n += 50;
          break;
        default:
          return;  /* ERROR.  return a NULL */
      }
      i++;
    }
  }
  testcase( n==sizeof(zBuf)-1 );
  testcase( n==sizeof(zBuf) );
  testcase( n==(u64)db->aLimit[SQLITE_LIMIT_LENGTH]+1 );
  testcase( n==(u64)db->aLimit[SQLITE_LIMIT_LENGTH] );
  if( n<sizeof(zBuf) ){
    z = zBuf;
  }else if( n>(u64)db->aLimit[SQLITE_LIMIT_LENGTH] ){
    sqlite3_result_error_toobig(context);
    return;
  }else{
    z = sqlite3DbMallocRawNN(db, (int)n);
    if( z==0 ){
      sqlite3_result_error_nomem(context);
      return;
    }
  }
  computeJD(&x);
  computeYMD_HMS(&x);
  for(i=j=0; zFmt[i]; i++){
    if( zFmt[i]!='%' ){
      z[j++] = zFmt[i];
    }else{
      i++;
      switch( zFmt[i] ){
        case 'd':  sqlite3_snprintf(3, &z[j],"%02d",x.D); j+=2; break;
        case 'f': {
          double s = x.s;
          if( s>59.999 ) s = 59.999;
          sqlite3_snprintf(7, &z[j],"%06.3f", s);
          j += sqlite3Strlen30(&z[j]);
          break;
        }
        case 'H':  sqlite3_snprintf(3, &z[j],"%02d",x.h); j+=2; break;
        case 'W': /* Fall thru */
        case 'j': {
          int nDay;             /* Number of days since 1st day of year */
          DateTime y = x;
          y.validJD = 0;
          y.M = 1;
          y.D = 1;
          computeJD(&y);
          nDay = (int)((x.iJD-y.iJD+43200000)/86400000);
          if( zFmt[i]=='W' ){
            int wd;   /* 0=Monday, 1=Tuesday, ... 6=Sunday */
            wd = (int)(((x.iJD+43200000)/86400000)%7);
            sqlite3_snprintf(3, &z[j],"%02d",(nDay+7-wd)/7);
            j += 2;
          }else{
            sqlite3_snprintf(4, &z[j],"%03d",nDay+1);
            j += 3;
          }
          break;
        }
        case 'J': {
          sqlite3_snprintf(20, &z[j],"%.16g",x.iJD/86400000.0);
          j+=sqlite3Strlen30(&z[j]);
          break;
        }
        case 'm':  sqlite3_snprintf(3, &z[j],"%02d",x.M); j+=2; break;
        case 'M':  sqlite3_snprintf(3, &z[j],"%02d",x.m); j+=2; break;
        case 's': {
          sqlite3_snprintf(30,&z[j],"%lld",
                           (i64)(x.iJD/1000 - 21086676*(i64)10000));
          j += sqlite3Strlen30(&z[j]);
          break;
        }
        case 'S':  sqlite3_snprintf(3,&z[j],"%02d",(int)x.s); j+=2; break;
        case 'w': {
          z[j++] = (char)(((x.iJD+129600000)/86400000) % 7) + '0';
          break;
        }
        case 'Y': {
          sqlite3_snprintf(5,&z[j],"%04d",x.Y); j+=sqlite3Strlen30(&z[j]);
          break;
        }
        default:   z[j++] = '%'; break;
      }
    }
  }
  z[j] = 0;
  sqlite3_result_text(context, z, -1,
                      z==zBuf ? SQLITE_TRANSIENT : SQLITE_DYNAMIC);
}